

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_add_passphrase.c
# Opt level: O2

archive_read_passphrase * new_read_passphrase(archive_read *a,char *passphrase)

{
  archive_read_passphrase *__ptr;
  char *pcVar1;
  
  __ptr = (archive_read_passphrase *)malloc(0x10);
  if (__ptr != (archive_read_passphrase *)0x0) {
    pcVar1 = strdup(passphrase);
    __ptr->passphrase = pcVar1;
    if (pcVar1 != (char *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
  return (archive_read_passphrase *)0x0;
}

Assistant:

static struct archive_read_passphrase *
new_read_passphrase(struct archive_read *a, const char *passphrase)
{
	struct archive_read_passphrase *p;

	p = malloc(sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (NULL);
	}
	p->passphrase = strdup(passphrase);
	if (p->passphrase == NULL) {
		free(p);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (NULL);
	}
	return (p);
}